

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int fits_set_compression_pref(fitsfile *infptr,fitsfile *outfptr,int *status)

{
  int iVar1;
  long lVar2;
  double dVar3;
  long local_148;
  LONGLONG dataend;
  LONGLONG datastart;
  double dStack_130;
  float hscale;
  double qvalue;
  char value [71];
  char local_d8 [2];
  char acStack_d6 [6];
  char card [81];
  long local_78;
  long tiledim [6];
  int local_3c;
  int local_38;
  int ivalue;
  int comptype;
  int nkeys;
  int naxis;
  int ii;
  int *status_local;
  fitsfile *outfptr_local;
  fitsfile *infptr_local;
  
  _naxis = status;
  status_local = &outfptr->HDUposition;
  outfptr_local = infptr;
  memset(&local_78,0,0x30);
  local_78 = 1;
  tiledim[0] = 1;
  tiledim[1] = 1;
  tiledim[2] = 1;
  tiledim[3] = 1;
  tiledim[4] = 1;
  if (*_naxis < 1) {
    ffghadll(outfptr_local,(LONGLONG *)0x0,&dataend,&local_148,_naxis);
    if (0xffffffff < local_148 - dataend) {
      fits_set_huge_hdu((fitsfile *)status_local,1,_naxis);
    }
    ffghsp(outfptr_local,&ivalue,(int *)0x0,_naxis);
    for (nkeys = 2; nkeys <= ivalue; nkeys = nkeys + 1) {
      ffgrec(outfptr_local,nkeys,local_d8,_naxis);
      iVar1 = strncmp(local_d8,"FZ",2);
      if (iVar1 == 0) {
        ffpsvc(local_d8,(char *)&qvalue,(char *)0x0,_naxis);
        iVar1 = strncmp(acStack_d6,"ALGOR",5);
        if (iVar1 == 0) {
          iVar1 = fits_strncasecmp((char *)&qvalue,"\'RICE_1",7);
          if (iVar1 == 0) {
            local_38 = 0xb;
          }
          else {
            iVar1 = fits_strncasecmp((char *)&qvalue,"\'GZIP_1",7);
            if (iVar1 == 0) {
              local_38 = 0x15;
            }
            else {
              iVar1 = fits_strncasecmp((char *)&qvalue,"\'GZIP_2",7);
              if (iVar1 == 0) {
                local_38 = 0x16;
              }
              else {
                iVar1 = fits_strncasecmp((char *)&qvalue,"\'PLIO_1",7);
                if (iVar1 == 0) {
                  local_38 = 0x1f;
                }
                else {
                  iVar1 = fits_strncasecmp((char *)&qvalue,"\'HCOMPRESS_1",0xc);
                  if (iVar1 == 0) {
                    local_38 = 0x29;
                  }
                  else {
                    iVar1 = fits_strncasecmp((char *)&qvalue,"\'NONE",5);
                    if (iVar1 != 0) {
                      ffpmsg("Unknown FZALGOR keyword compression algorithm:");
                      ffpmsg((char *)&qvalue);
                      *_naxis = 0x19d;
                      return 0x19d;
                    }
                    local_38 = -1;
                  }
                }
              }
            }
          }
          fits_set_compression_type((fitsfile *)status_local,local_38,_naxis);
        }
        else {
          iVar1 = strncmp(acStack_d6,"TILE  ",6);
          if (iVar1 == 0) {
            iVar1 = fits_strncasecmp((char *)&qvalue,"\'row",4);
            if (iVar1 == 0) {
              local_78 = -1;
            }
            else {
              iVar1 = fits_strncasecmp((char *)&qvalue,"\'whole",6);
              if (iVar1 == 0) {
                local_78 = -1;
                tiledim[0] = -1;
                tiledim[1] = -1;
              }
              else {
                ffdtdm(outfptr_local,(char *)&qvalue,0,6,&comptype,&local_78,_naxis);
              }
            }
            fits_set_tile_dim((fitsfile *)status_local,6,&local_78,_naxis);
          }
          else {
            iVar1 = strncmp(acStack_d6,"QVALUE",6);
            if (iVar1 == 0) {
              dStack_130 = atof((char *)&qvalue);
              fits_set_quantize_level((fitsfile *)status_local,(float)dStack_130,_naxis);
            }
            else {
              iVar1 = strncmp(acStack_d6,"QMETHD",6);
              if (iVar1 == 0) {
                iVar1 = fits_strncasecmp((char *)&qvalue,"\'no_dither",10);
                if (iVar1 == 0) {
                  local_3c = -1;
                }
                else {
                  iVar1 = fits_strncasecmp((char *)&qvalue,"\'subtractive_dither_1",0x15);
                  if (iVar1 == 0) {
                    local_3c = 1;
                  }
                  else {
                    iVar1 = fits_strncasecmp((char *)&qvalue,"\'subtractive_dither_2",0x15);
                    if (iVar1 != 0) {
                      ffpmsg("Unknown value for FZQUANT keyword: (set_compression_pref)");
                      ffpmsg((char *)&qvalue);
                      *_naxis = 0x19d;
                      return 0x19d;
                    }
                    local_3c = 2;
                  }
                }
                fits_set_quantize_method((fitsfile *)status_local,local_3c,_naxis);
              }
              else {
                iVar1 = strncmp(acStack_d6,"DTHRSD",6);
                if (iVar1 == 0) {
                  iVar1 = fits_strncasecmp((char *)&qvalue,"\'checksum",9);
                  if (iVar1 == 0) {
                    local_3c = -1;
                  }
                  else {
                    iVar1 = fits_strncasecmp((char *)&qvalue,"\'clock",6);
                    if (iVar1 == 0) {
                      local_3c = 0;
                    }
                    else {
                      if (qvalue._0_1_ == '\'') {
                        lVar2 = atol((char *)((long)&qvalue + 1));
                        local_3c = (int)lVar2;
                      }
                      else {
                        lVar2 = atol((char *)&qvalue);
                        local_3c = (int)lVar2;
                      }
                      if ((local_3c < 1) || (10000 < local_3c)) {
                        ffpmsg("Invalid value for FZDTHRSD keyword: (set_compression_pref)");
                        ffpmsg((char *)&qvalue);
                        *_naxis = 0x19d;
                        return 0x19d;
                      }
                    }
                  }
                  fits_set_dither_seed((fitsfile *)status_local,local_3c,_naxis);
                }
                else {
                  iVar1 = strncmp(acStack_d6,"I2F",3);
                  if (iVar1 == 0) {
                    iVar1 = fits_strcasecmp((char *)&qvalue,"t");
                    if (iVar1 == 0) {
                      fits_set_lossy_int((fitsfile *)status_local,1,_naxis);
                    }
                    else {
                      iVar1 = fits_strcasecmp((char *)&qvalue,"f");
                      if (iVar1 != 0) {
                        ffpmsg("Unknown value for FZI2F keyword: (set_compression_pref)");
                        ffpmsg((char *)&qvalue);
                        *_naxis = 0x19d;
                        return 0x19d;
                      }
                      fits_set_lossy_int((fitsfile *)status_local,0,_naxis);
                    }
                  }
                  else {
                    iVar1 = strncmp(acStack_d6,"HSCALE ",6);
                    if (iVar1 == 0) {
                      dVar3 = atof((char *)&qvalue);
                      datastart._4_4_ = (float)dVar3;
                      fits_set_hcomp_scale((fitsfile *)status_local,datastart._4_4_,_naxis);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    infptr_local._4_4_ = *_naxis;
  }
  else {
    infptr_local._4_4_ = *_naxis;
  }
  return infptr_local._4_4_;
}

Assistant:

int fits_set_compression_pref(
      fitsfile *infptr,
      fitsfile *outfptr,
      int *status) 
{
/*
   Set the preference for various compression options, based
   on keywords in the input file that
   provide guidance about how the HDU should be compressed when written
   to the output file.
*/

    int ii, naxis, nkeys, comptype;
    int  ivalue;
    long tiledim[6]= {1,1,1,1,1,1};
    char card[FLEN_CARD], value[FLEN_VALUE];
    double  qvalue;
    float hscale;
    LONGLONG datastart, dataend; 
    if (*status > 0)
        return(*status);

    /* check the size of the HDU that is to be compressed */
    fits_get_hduaddrll(infptr, NULL, &datastart, &dataend, status);
    if ( (LONGLONG)(dataend - datastart) > UINT32_MAX) {
       /* use 64-bit '1Q' variable length columns instead of '1P' columns */
       /* for large files, in case the heap size becomes larger than 2**32 bytes*/
       fits_set_huge_hdu(outfptr, 1, status);
    }

    fits_get_hdrspace(infptr, &nkeys, NULL, status);
 
   /* look for a image compression directive keywords (begin with 'FZ') */
    for (ii = 2; ii <= nkeys; ii++) {
        
	fits_read_record(infptr, ii, card, status);

	if (!strncmp(card, "FZ", 2) ){
	
            /* get the keyword value string */
            fits_parse_value(card, value, NULL, status);
	    
	    if      (!strncmp(card+2, "ALGOR", 5) ) {

	        /* set the desired compression algorithm */
                /* allowed values: RICE_1, GZIP_1, GZIP_2, PLIO_1,     */
                /*  HCOMPRESS_1, BZIP2_1, and NOCOMPRESS               */

                if        (!fits_strncasecmp(value, "'RICE_1", 7) ) {
		    comptype = RICE_1;
                } else if (!fits_strncasecmp(value, "'GZIP_1", 7) ) {
		    comptype = GZIP_1;
                } else if (!fits_strncasecmp(value, "'GZIP_2", 7) ) {
		    comptype = GZIP_2;
                } else if (!fits_strncasecmp(value, "'PLIO_1", 7) ) {
		    comptype = PLIO_1;
                } else if (!fits_strncasecmp(value, "'HCOMPRESS_1", 12) ) {
		    comptype = HCOMPRESS_1;
                } else if (!fits_strncasecmp(value, "'NONE", 5) ) {
		    comptype = NOCOMPRESS;
		} else {
			ffpmsg("Unknown FZALGOR keyword compression algorithm:");
			ffpmsg(value);
			return(*status = DATA_COMPRESSION_ERR);
		}  

	        fits_set_compression_type (outfptr, comptype, status);

	    } else if (!strncmp(card+2, "TILE  ", 6) ) {

                if (!fits_strncasecmp(value, "'row", 4) ) {
                   tiledim[0] = -1;
		} else if (!fits_strncasecmp(value, "'whole", 6) ) {
                   tiledim[0] = -1;
                   tiledim[1] = -1;
                   tiledim[2] = -1;
                } else {
		   ffdtdm(infptr, value, 0,6, &naxis, tiledim, status);
                }

	        /* set the desired tile size */
		fits_set_tile_dim (outfptr, 6, tiledim, status);

	    } else if (!strncmp(card+2, "QVALUE", 6) ) {

	        /* set the desired Q quantization value */
		qvalue = atof(value);
		fits_set_quantize_level (outfptr, (float) qvalue, status);

	    } else if (!strncmp(card+2, "QMETHD", 6) ) {

                    if (!fits_strncasecmp(value, "'no_dither", 10) ) {
                        ivalue = -1; /* just quantize, with no dithering */
		    } else if (!fits_strncasecmp(value, "'subtractive_dither_1", 21) ) {
                        ivalue = SUBTRACTIVE_DITHER_1; /* use subtractive dithering */
		    } else if (!fits_strncasecmp(value, "'subtractive_dither_2", 21) ) {
                        ivalue = SUBTRACTIVE_DITHER_2; /* dither, except preserve zero-valued pixels */
		    } else {
		        ffpmsg("Unknown value for FZQUANT keyword: (set_compression_pref)");
			ffpmsg(value);
                        return(*status = DATA_COMPRESSION_ERR);
		    }

		    fits_set_quantize_method(outfptr, ivalue, status);
		    
	    } else if (!strncmp(card+2, "DTHRSD", 6) ) {

                if (!fits_strncasecmp(value, "'checksum", 9) ) {
                    ivalue = -1; /* use checksum of first tile */
		} else if (!fits_strncasecmp(value, "'clock", 6) ) {
                    ivalue = 0; /* set dithering seed based on system clock */
		} else {  /* read integer value */
		    if (*value == '\'')
                        ivalue = (int) atol(value+1); /* allow for leading quote character */
                    else 
                        ivalue = (int) atol(value); 

                    if (ivalue < 1 || ivalue > 10000) {
		        ffpmsg("Invalid value for FZDTHRSD keyword: (set_compression_pref)");
			ffpmsg(value);
                        return(*status = DATA_COMPRESSION_ERR);
                    }
		}

	        /* set the desired dithering */
		fits_set_dither_seed(outfptr, ivalue, status);

	    } else if (!strncmp(card+2, "I2F", 3) ) {

	        /* set whether to convert integers to float then use lossy compression */
                if (!fits_strcasecmp(value, "t") ) {
		    fits_set_lossy_int (outfptr, 1, status);
		} else if (!fits_strcasecmp(value, "f") ) {
		    fits_set_lossy_int (outfptr, 0, status);
		} else {
		        ffpmsg("Unknown value for FZI2F keyword: (set_compression_pref)");
			ffpmsg(value);
                        return(*status = DATA_COMPRESSION_ERR);
                }

	    } else if (!strncmp(card+2, "HSCALE ", 6) ) {

	        /* set the desired Hcompress scale value */
		hscale = (float) atof(value);
		fits_set_hcomp_scale (outfptr, hscale, status);
            }
	}    
    }
    return(*status);
}